

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

Abc_ManTime_t * Abc_ManTimeStart(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  Abc_ManTime_t *p_00;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pAVar4;
  int local_2c;
  int i;
  Abc_Obj_t *pObj;
  Abc_ManTime_t *p;
  int fUseZeroDefaultOutputRequired;
  Abc_Ntk_t *pNtk_local;
  
  p_00 = (Abc_ManTime_t *)malloc(0x40);
  pNtk->pManTime = p_00;
  memset(p_00,0,0x40);
  pVVar3 = Vec_PtrAlloc(0);
  p_00->vArrs = pVVar3;
  pVVar3 = Vec_PtrAlloc(0);
  p_00->vReqs = pVVar3;
  (p_00->tReqDef).Rise = 0.0;
  (p_00->tReqDef).Fall = 0.0;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Abc_ManTimeExpand(p_00,iVar1 + 1,0);
  for (local_2c = 0; iVar1 = Abc_NtkCiNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar4 = Abc_NtkCi(pNtk,local_2c);
    uVar2 = Abc_ObjId(pAVar4);
    Abc_NtkTimeSetArrival(pNtk,uVar2,(p_00->tArrDef).Rise,(p_00->tArrDef).Rise);
  }
  for (local_2c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar4 = Abc_NtkCo(pNtk,local_2c);
    uVar2 = Abc_ObjId(pAVar4);
    Abc_NtkTimeSetRequired(pNtk,uVar2,(p_00->tReqDef).Rise,(p_00->tReqDef).Rise);
  }
  return p_00;
}

Assistant:

Abc_ManTime_t * Abc_ManTimeStart( Abc_Ntk_t * pNtk )
{
    int fUseZeroDefaultOutputRequired = 1;
    Abc_ManTime_t * p;
    Abc_Obj_t * pObj; int i;
    p = pNtk->pManTime = ABC_ALLOC( Abc_ManTime_t, 1 );
    memset( p, 0, sizeof(Abc_ManTime_t) );
    p->vArrs = Vec_PtrAlloc( 0 );
    p->vReqs = Vec_PtrAlloc( 0 );
    // set default default input=arrivals (assumed to be 0)
    // set default default output-requireds (can be either 0 or +infinity, based on the flag)
    p->tReqDef.Rise = fUseZeroDefaultOutputRequired ? 0 : ABC_INFINITY;
    p->tReqDef.Fall = fUseZeroDefaultOutputRequired ? 0 : ABC_INFINITY;
    // extend manager
    Abc_ManTimeExpand( p, Abc_NtkObjNumMax(pNtk) + 1, 0 );
    // set the default timing for CIs
    Abc_NtkForEachCi( pNtk, pObj, i )
        Abc_NtkTimeSetArrival( pNtk, Abc_ObjId(pObj), p->tArrDef.Rise, p->tArrDef.Rise );   
    // set the default timing for COs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Abc_NtkTimeSetRequired( pNtk, Abc_ObjId(pObj), p->tReqDef.Rise, p->tReqDef.Rise );        
    return p;
}